

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_SecureChannel_detachSession(UA_SecureChannel *channel,UA_Session *session)

{
  SessionEntry *pSVar1;
  SessionEntry *__ptr;
  
  if (session != (UA_Session *)0x0) {
    session->channel = (UA_SecureChannel *)0x0;
  }
  __ptr = (SessionEntry *)&channel->sessions;
  do {
    __ptr = (__ptr->pointers).le_next;
    if (__ptr == (SessionEntry *)0x0) {
      return;
    }
  } while (__ptr->session != session);
  pSVar1 = (__ptr->pointers).le_next;
  if (pSVar1 != (SessionEntry *)0x0) {
    (pSVar1->pointers).le_prev = (__ptr->pointers).le_prev;
  }
  *(__ptr->pointers).le_prev = pSVar1;
  free(__ptr);
  return;
}

Assistant:

void UA_SecureChannel_detachSession(UA_SecureChannel *channel, UA_Session *session) {
    if(session)
        session->channel = NULL;
    struct SessionEntry *se;
    LIST_FOREACH(se, &channel->sessions, pointers) {
        if(se->session == session)
            break;
    }
    if(!se)
        return;
    LIST_REMOVE(se, pointers);
    UA_free(se);
}